

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  code *pcVar1;
  env *peVar2;
  string *in_RSI;
  confirm *in_RDI;
  message *e;
  text *in_stack_ffffffffffffff78;
  string local_30 [48];
  
  in_RDI->selected = in_RDI->selected + 1;
  pcVar1 = *(code **)(in_RSI + 0x20);
  std::__cxx11::string::string(local_30,in_RSI);
  peVar2 = env::operator()((env *)in_RDI,in_stack_ffffffffffffff78);
  (*pcVar1)(peVar2);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }